

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_OneofPresence_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceSerializeTest_OneofPresence_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  ArenaStringPtr *this_00;
  pointer pcVar1;
  bool bVar2;
  Arena *arena;
  char *in_R9;
  pointer *__ptr_1;
  char *pcVar3;
  pointer *__ptr;
  pointer *__ptr_5;
  pointer *__ptr_4;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view value;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_4;
  TestAllTypes message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_320;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  undefined1 local_308 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  AssertHelper local_2e8;
  undefined1 local_2e0 [688];
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)local_2e0,(Arena *)0x0);
  if (local_2e0._680_4_ != 0x71) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2e0);
    local_2e0._680_4_ = 0x71;
    local_2e0._672_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  this_00 = (ArenaStringPtr *)(local_2e0 + 0x2a0);
  arena = (Arena *)local_2e0._8_8_;
  if ((local_2e0._8_8_ & 1) != 0) {
    arena = *(Arena **)(local_2e0._8_8_ & 0xfffffffffffffffe);
  }
  pcVar3 = anon_var_dwarf_a12c75 + 5;
  protobuf::internal::ArenaStringPtr::Set(this_00,(string_view)(ZEXT816(0x1141ae9) << 0x40),arena);
  output = &(this->
            super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).value_;
  bVar2 = MessageLite::SerializeToString((MessageLite *)local_2e0,output);
  local_318._M_head_impl._0_1_ = (internal)bVar2;
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_308,(internal *)&local_318,
               (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4d3,(char *)local_308);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    if (local_320._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_310,local_310);
    }
    if (!bVar2) goto LAB_008d207a;
  }
  local_2e8.data_._0_4_ = 3;
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  local_320._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_318,"3","this->GetOutput().size()",(int *)&local_2e8,
             (unsigned_long *)&local_320);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_308);
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4d7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_308 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_308 + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  local_320._M_head_impl._0_1_ = 0x8a;
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  if (local_300 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
  }
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&local_318,"static_cast<char>(0x8a)","this->GetOutput().at(0)",
             (char *)&local_320,(char *)local_308);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_308);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4d8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_308 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_308 + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  local_320._M_head_impl._0_1_ = 7;
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  if (local_300 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2) {
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",1);
  }
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&local_318,"static_cast<char>(0x07)","this->GetOutput().at(1)",
             (char *)&local_320,(char *)((long)local_308 + 1));
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_308);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4d9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_308 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_308 + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  local_320._M_head_impl = local_320._M_head_impl & 0xffffffffffffff00;
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  if (local_300 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3) {
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",2);
  }
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&local_318,"static_cast<char>(0x00)","this->GetOutput().at(2)",
             (char *)&local_320,(char *)((long)local_308 + 2));
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_308);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4da,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_308 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_308 + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2e0);
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  data._M_str = (char *)local_308;
  data._M_len = (size_t)local_300;
  bVar2 = MessageLite::ParseFromString((MessageLite *)local_2e0,data);
  local_318._M_head_impl._0_1_ = (internal)bVar2;
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_308,(internal *)&local_318,
               (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4dd,(char *)local_308);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    if (local_320._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  local_318._M_head_impl._0_4_ = 0x71;
  local_320._M_head_impl._0_4_ = local_2e0._680_4_;
  testing::internal::
  CmpHelperEQ<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase>
            ((internal *)local_308,"TestAllTypes::kOneofString","message.oneof_field_case()",
             (OneofFieldCase *)&local_318,(OneofFieldCase *)&local_320);
  if (local_308[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_318);
    if (local_300 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_300->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4de,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_318._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_318._M_head_impl + 8))();
    }
  }
  if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_300,local_300);
  }
  proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2e0);
  if (local_2e0._680_4_ != 0x6f) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2e0);
    local_2e0._680_4_ = 0x6f;
  }
  local_2e0._672_8_ = local_2e0._672_8_ & 0xffffffff00000000;
  bVar2 = MessageLite::SerializeToString((MessageLite *)local_2e0,output);
  local_318._M_head_impl._0_1_ = (internal)bVar2;
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_308,(internal *)&local_318,
               (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4e3,(char *)local_308);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    if (local_320._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_310,local_310);
    }
    if (!bVar2) goto LAB_008d207a;
  }
  local_2e8.data_._0_4_ = 3;
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  local_320._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_318,"3","this->GetOutput().size()",(int *)&local_2e8,
             (unsigned_long *)&local_320);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_308);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4e4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_308 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_308 + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  data_00._M_str = (char *)local_308;
  data_00._M_len = (size_t)local_300;
  bVar2 = MessageLite::ParseFromString((MessageLite *)local_2e0,data_00);
  local_318._M_head_impl._0_1_ = (internal)bVar2;
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_308,(internal *)&local_318,
               (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4e5,(char *)local_308);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  local_318._M_head_impl._0_4_ = 0x6f;
  local_320._M_head_impl._0_4_ = local_2e0._680_4_;
  testing::internal::
  CmpHelperEQ<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase>
            ((internal *)local_308,"TestAllTypes::kOneofUint32","message.oneof_field_case()",
             (OneofFieldCase *)&local_318,(OneofFieldCase *)&local_320);
  if (local_308[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_318);
    if (local_300 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_300->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4e6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_318._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_318._M_head_impl + 8))();
    }
  }
  if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_300,local_300);
  }
  proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2e0);
  if (local_2e0._680_4_ != 0x72) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2e0);
    local_2e0._680_4_ = 0x72;
  }
  local_2e0._672_8_ = local_2e0._672_8_ & 0xffffffff00000000;
  bVar2 = MessageLite::SerializeToString((MessageLite *)local_2e0,output);
  local_318._M_head_impl._0_1_ = (internal)bVar2;
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_308,(internal *)&local_318,
               (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4ea,(char *)local_308);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    if (local_320._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
    if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_310,local_310);
    }
    if (!bVar2) goto LAB_008d207a;
  }
  local_2e8.data_._0_4_ = 3;
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  local_320._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_318,"3","this->GetOutput().size()",(int *)&local_2e8,
             (unsigned_long *)&local_320);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_308);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4eb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_308 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_308 + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  pcVar1 = (this->
           super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->
                      super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).value_._M_string_length);
  data_01._M_str = (char *)local_308;
  data_01._M_len = (size_t)local_300;
  bVar2 = MessageLite::ParseFromString((MessageLite *)local_2e0,data_01);
  local_318._M_head_impl._0_1_ = (internal)bVar2;
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  if (local_318._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_308,(internal *)&local_318,
               (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4ec,(char *)local_308);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_320._M_head_impl + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  local_318._M_head_impl._0_4_ = 0x72;
  local_320._M_head_impl._0_4_ = local_2e0._680_4_;
  testing::internal::
  CmpHelperEQ<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase>
            ((internal *)local_308,"TestAllTypes::kOneofEnum","message.oneof_field_case()",
             (OneofFieldCase *)&local_318,(OneofFieldCase *)&local_320);
  if (local_308[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_318);
    if (local_300 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_300->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4ed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_318._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_318._M_head_impl + 8))();
    }
  }
  if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_300,local_300);
  }
  proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2e0);
  if (local_2e0._680_4_ != 0x71) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2e0);
    local_2e0._680_4_ = 0x71;
    local_2e0._672_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  if ((local_2e0._8_8_ & 1) != 0) {
    local_2e0._8_8_ = *(undefined8 *)(local_2e0._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "test";
  value._M_len = 4;
  protobuf::internal::ArenaStringPtr::Set(this_00,value,(Arena *)local_2e0._8_8_);
  if (local_2e0._680_4_ == 0x71) {
    protobuf::internal::ArenaStringPtr::Destroy(this_00);
    local_2e0._680_4_ = 0;
  }
  local_320._M_head_impl = local_320._M_head_impl & 0xffffffff00000000;
  local_318._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       proto2_nofieldpresence_unittest::TestAllTypes::ByteSizeLong((TestAllTypes *)local_2e0);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_308,"0","message.ByteSizeLong()",(int *)&local_320,
             (unsigned_long *)&local_318);
  if (local_308[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_318);
    if (local_300 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_300->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4f2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (local_318._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_318._M_head_impl + 8))();
    }
  }
  if (local_300 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_300,local_300);
  }
LAB_008d207a:
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2e0);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, OneofPresence) {
  TestAllTypes message;
  // oneof fields still have field presence -- ensure that this goes on the wire
  // even though its value is the empty string.
  message.set_oneof_string("");
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  // Tag: 113 --> tag is (113 << 3) | 2 (length delimited) = 906
  // varint: 0x8a 0x07
  // Length: 0x00
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_EQ(static_cast<char>(0x8a), this->GetOutput().at(0));
  EXPECT_EQ(static_cast<char>(0x07), this->GetOutput().at(1));
  EXPECT_EQ(static_cast<char>(0x00), this->GetOutput().at(2));

  message.Clear();
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofString, message.oneof_field_case());

  // Also test int32 and enum fields.
  message.Clear();
  message.set_oneof_uint32(0);  // would not go on wire if ordinary field.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofUint32, message.oneof_field_case());

  message.Clear();
  message.set_oneof_enum(TestAllTypes::FOO);  // FOO is the default value.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofEnum, message.oneof_field_case());

  message.Clear();
  message.set_oneof_string("test");
  message.clear_oneof_string();
  EXPECT_EQ(0, message.ByteSizeLong());
}